

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

void NJamSpell::
     InitializeBuckets<std::unordered_map<std::tuple<unsigned_int,unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram3KeyHash,std::equal_to<std::tuple<unsigned_int,unsigned_int,unsigned_int>>,std::allocator<std::pair<std::tuple<unsigned_int,unsigned_int,unsigned_int>const,unsigned_int>>>>
               (unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                *grams,TPerfectHash *ph,
               vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
               *buckets)

{
  pointer ppVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *extraout_RDX;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *extraout_RDX_00;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *key_00;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  undefined1 local_58 [8];
  string key;
  
  p_Var7 = (grams->_M_h)._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    key_00 = buckets;
    key.field_2._8_8_ = ph;
    do {
      DumpKey<std::tuple<unsigned_int,unsigned_int,unsigned_int>>
                ((string *)local_58,(NJamSpell *)(p_Var7 + 1),
                 (tuple<unsigned_int,_unsigned_int,_unsigned_int> *)key_00);
      uVar4 = TPerfectHash::Hash((TPerfectHash *)key.field_2._8_8_,(string *)local_58);
      uVar6 = (ulong)uVar4;
      if ((ulong)((long)(buckets->
                        super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(buckets->
                        super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      if ((ulong)((long)(buckets->
                        super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(buckets->
                        super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
        __assert_fail("bucket < buckets.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/jamspell/lang_model.cpp"
                      ,0x5a,
                      "void NJamSpell::InitializeBuckets(const T &, TPerfectHash &, std::vector<std::pair<uint16_t, uint16_t>> &) [T = std::unordered_map<std::tuple<unsigned int, unsigned int, unsigned int>, unsigned int, NJamSpell::TGram3KeyHash>]"
                     );
      }
      uVar2 = CityHash16((string *)local_58);
      uVar3 = PackInt32(*(uint32_t *)((long)&p_Var7[2]._M_nxt + 4));
      ppVar1 = (buckets->
               super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar1[uVar6].first = uVar2;
      ppVar1[uVar6].second = uVar3;
      key_00 = extraout_RDX;
      if (local_58 != (undefined1  [8])&key._M_string_length) {
        operator_delete((void *)local_58);
        key_00 = extraout_RDX_00;
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void InitializeBuckets(const T& grams, TPerfectHash& ph, std::vector<std::pair<uint16_t, uint16_t>>& buckets) {
    for (auto&& it: grams) {
        std::string key = DumpKey(it.first);
        uint32_t bucket = ph.Hash(key);
        if (bucket >= buckets.size()) {
            std::cerr << bucket << " " << buckets.size() << "\n";
        }
        assert(bucket < buckets.size());
        std::pair<uint16_t, uint16_t> data;
        data.first = CityHash16(key);
        data.second = PackInt32(it.second);
        buckets[bucket] = data;
    }
}